

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t tar_atol(char *p,size_t char_cnt)

{
  size_t in_RSI;
  char *in_RDI;
  undefined8 local_8;
  
  if (((int)*in_RDI & 0x80U) == 0) {
    local_8 = tar_atol8(in_RDI,in_RSI);
  }
  else {
    local_8 = tar_atol256(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

static int64_t
tar_atol(const char *p, size_t char_cnt)
{
	/*
	 * Technically, GNU tar considers a field to be in base-256
	 * only if the first byte is 0xff or 0x80.
	 */
	if (*p & 0x80)
		return (tar_atol256(p, char_cnt));
	return (tar_atol8(p, char_cnt));
}